

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

bool __thiscall QLayoutPrivate::checkWidget(QLayoutPrivate *this,QWidget *widget)

{
  QLayout *this_00;
  bool bVar1;
  QWidget *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QArrayData *local_88;
  QArrayData *local_70;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLayout **)&this->field_0x8;
  if (widget == (QWidget *)0x0) {
    checkWidget();
  }
  else {
    pQVar2 = QLayout::parentWidget(this_00);
    bVar1 = true;
    if (pQVar2 != widget) goto LAB_002eafe2;
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_40 = "default";
    (*(code *)**(undefined8 **)widget)(widget);
    uVar3 = QMetaObject::className();
    QObject::objectName();
    uVar4 = QString::utf16();
    (*(code *)**(undefined8 **)this_00)(this_00);
    uVar5 = QMetaObject::className();
    QObject::objectName();
    uVar6 = QString::utf16();
    QMessageLogger::warning
              (local_58,"QLayout: Cannot add parent widget %s/%ls to its child layout %s/%ls",uVar3,
               uVar4,uVar5,uVar6);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
  }
  bVar1 = false;
LAB_002eafe2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QLayoutPrivate::checkWidget(QWidget *widget) const
{
    Q_Q(const QLayout);
    if (Q_UNLIKELY(!widget)) {
        qWarning("QLayout: Cannot add a null widget to %s/%ls", q->metaObject()->className(),
                  qUtf16Printable(q->objectName()));
        return false;
    }
    if (Q_UNLIKELY(widget == q->parentWidget())) {
        qWarning("QLayout: Cannot add parent widget %s/%ls to its child layout %s/%ls",
                  widget->metaObject()->className(), qUtf16Printable(widget->objectName()),
                  q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    return true;
}